

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void decodeGeneric(uchar **out,uint *w,uint *h,LodePNGState *state,uchar *in,size_t insize)

{
  bool bVar1;
  bool bVar2;
  uchar uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  LodePNGColorMode *color_00;
  uchar *puVar7;
  bool bVar8;
  LodePNGColorMode *color;
  size_t oldsize;
  uchar *data;
  int local_a0;
  uint chunkLength;
  uint critical_pos;
  uint unknown;
  size_t outsize;
  size_t numpixels;
  size_t predict;
  ucvector scanlines;
  ucvector idat;
  size_t i;
  uchar *chunk;
  uchar IEND;
  size_t insize_local;
  uchar *in_local;
  LodePNGState *state_local;
  uint *h_local;
  uint *w_local;
  uchar **out_local;
  
  bVar1 = false;
  _critical_pos = 0;
  bVar2 = false;
  local_a0 = 1;
  *out = (uchar *)0x0;
  uVar4 = lodepng_inspect(w,h,state,in,insize);
  state->error = uVar4;
  if (state->error == 0) {
    if ((*h == 0) || ((ulong)(*w * *h) / (ulong)*h == (ulong)*w)) {
      if ((ulong)(*w * *h) < 0x10000000) {
        ucvector_init((ucvector *)&scanlines.allocsize);
        i = (size_t)(in + 0x21);
LAB_0011477c:
        bVar8 = false;
        if (!bVar1) {
          bVar8 = state->error == 0;
        }
        if (!bVar8) goto LAB_00114d23;
        if ((insize < (i - (long)in) + 0xc) || (i < in)) {
          state->error = 0x1e;
          goto LAB_00114d23;
        }
        uVar4 = lodepng_chunk_length((uchar *)i);
        if (0x7fffffff < uVar4) {
          state->error = 0x3f;
          goto LAB_00114d23;
        }
        if ((insize < (i - (long)in) + (ulong)uVar4 + 0xc) || ((uchar *)(i + uVar4 + 0xc) < in)) {
          state->error = 0x40;
          goto LAB_00114d23;
        }
        puVar7 = lodepng_chunk_data_const((uchar *)i);
        uVar3 = lodepng_chunk_type_equals((uchar *)i,"IDAT");
        if (uVar3 == '\0') {
          uVar3 = lodepng_chunk_type_equals((uchar *)i,"IEND");
          if (uVar3 == '\0') {
            uVar3 = lodepng_chunk_type_equals((uchar *)i,"PLTE");
            if (uVar3 == '\0') {
              uVar3 = lodepng_chunk_type_equals((uchar *)i,"tRNS");
              if (uVar3 == '\0') {
                uVar3 = lodepng_chunk_type_equals((uchar *)i,"bKGD");
                if (uVar3 == '\0') {
                  uVar3 = lodepng_chunk_type_equals((uchar *)i,"tEXt");
                  if (uVar3 == '\0') {
                    uVar3 = lodepng_chunk_type_equals((uchar *)i,"zTXt");
                    if (uVar3 == '\0') {
                      uVar3 = lodepng_chunk_type_equals((uchar *)i,"iTXt");
                      if (uVar3 == '\0') {
                        uVar3 = lodepng_chunk_type_equals((uchar *)i,"tIME");
                        if (uVar3 == '\0') {
                          uVar3 = lodepng_chunk_type_equals((uchar *)i,"pHYs");
                          if (uVar3 == '\0') {
                            uVar3 = lodepng_chunk_ancillary((uchar *)i);
                            if (uVar3 == '\0') {
                              state->error = 0x45;
                              goto LAB_00114d23;
                            }
                            bVar2 = true;
                            if ((state->decoder).remember_unknown_chunks == 0) goto LAB_00114cd8;
                            uVar4 = lodepng_chunk_append
                                              ((state->info_png).unknown_chunks_data +
                                               (local_a0 - 1),
                                               (state->info_png).unknown_chunks_size +
                                               (local_a0 - 1),(uchar *)i);
                            state->error = uVar4;
                            uVar4 = state->error;
                          }
                          else {
                            uVar4 = readChunk_pHYs(&state->info_png,puVar7,(ulong)uVar4);
                            state->error = uVar4;
                            uVar4 = state->error;
                          }
                        }
                        else {
                          uVar4 = readChunk_tIME(&state->info_png,puVar7,(ulong)uVar4);
                          state->error = uVar4;
                          uVar4 = state->error;
                        }
                      }
                      else {
                        if ((state->decoder).read_text_chunks == 0) goto LAB_00114cd8;
                        uVar4 = readChunk_iTXt(&state->info_png,&(state->decoder).zlibsettings,
                                               puVar7,(ulong)uVar4);
                        state->error = uVar4;
                        uVar4 = state->error;
                      }
                    }
                    else {
                      if ((state->decoder).read_text_chunks == 0) goto LAB_00114cd8;
                      uVar4 = readChunk_zTXt(&state->info_png,&(state->decoder).zlibsettings,puVar7,
                                             (ulong)uVar4);
                      state->error = uVar4;
                      uVar4 = state->error;
                    }
                  }
                  else {
                    if ((state->decoder).read_text_chunks == 0) goto LAB_00114cd8;
                    uVar4 = readChunk_tEXt(&state->info_png,puVar7,(ulong)uVar4);
                    state->error = uVar4;
                    uVar4 = state->error;
                  }
                }
                else {
                  uVar4 = readChunk_bKGD(&state->info_png,puVar7,(ulong)uVar4);
                  state->error = uVar4;
                  uVar4 = state->error;
                }
              }
              else {
                uVar4 = readChunk_tRNS(&(state->info_png).color,puVar7,(ulong)uVar4);
                state->error = uVar4;
                uVar4 = state->error;
              }
              if (uVar4 != 0) goto LAB_00114d23;
            }
            else {
              uVar4 = readChunk_PLTE(&(state->info_png).color,puVar7,(ulong)uVar4);
              state->error = uVar4;
              if (state->error != 0) goto LAB_00114d23;
              local_a0 = 2;
            }
          }
          else {
            bVar1 = true;
          }
        }
        else {
          uVar5 = ucvector_resize((ucvector *)&scanlines.allocsize,(size_t)(idat.data + uVar4));
          if (uVar5 == 0) {
            state->error = 0x53;
            goto LAB_00114d23;
          }
          for (idat.allocsize = 0; idat.allocsize != uVar4; idat.allocsize = idat.allocsize + 1) {
            idat.data[scanlines.allocsize + idat.allocsize] = puVar7[idat.allocsize];
          }
          local_a0 = 3;
        }
LAB_00114cd8:
        if ((((state->decoder).ignore_crc != 0) || (bVar2)) ||
           (uVar4 = lodepng_chunk_check_crc((uchar *)i), uVar4 == 0)) {
          if (!bVar1) {
            i = (size_t)lodepng_chunk_next_const((uchar *)i);
          }
          goto LAB_0011477c;
        }
        state->error = 0x39;
LAB_00114d23:
        ucvector_init((ucvector *)&predict);
        if ((state->info_png).interlace_method == 0) {
          sVar6 = lodepng_get_raw_size_idat(*w,*h,&(state->info_png).color);
          numpixels = sVar6 + *h;
        }
        else {
          color_00 = &(state->info_png).color;
          sVar6 = lodepng_get_raw_size_idat(*w + 7 >> 3,*h + 7 >> 3,color_00);
          numpixels = sVar6 + (*h + 7 >> 3);
          if (4 < *w) {
            sVar6 = lodepng_get_raw_size_idat(*w + 3 >> 3,*h + 7 >> 3,color_00);
            numpixels = sVar6 + (*h + 7 >> 3) + numpixels;
          }
          sVar6 = lodepng_get_raw_size_idat(*w + 3 >> 2,*h + 3 >> 3,color_00);
          numpixels = sVar6 + (*h + 3 >> 3) + numpixels;
          if (2 < *w) {
            sVar6 = lodepng_get_raw_size_idat(*w + 1 >> 2,*h + 3 >> 2,color_00);
            numpixels = sVar6 + (*h + 3 >> 2) + numpixels;
          }
          sVar6 = lodepng_get_raw_size_idat(*w + 1 >> 1,*h + 1 >> 2,color_00);
          numpixels = sVar6 + (*h + 1 >> 2) + numpixels;
          if (1 < *w) {
            sVar6 = lodepng_get_raw_size_idat(*w >> 1,*h + 1 >> 1,color_00);
            numpixels = sVar6 + (*h + 1 >> 1) + numpixels;
          }
          sVar6 = lodepng_get_raw_size_idat(*w,*h >> 1,color_00);
          numpixels = sVar6 + (*h >> 1) + numpixels;
        }
        if ((state->error == 0) &&
           (uVar4 = ucvector_reserve((ucvector *)&predict,numpixels), uVar4 == 0)) {
          state->error = 0x53;
        }
        if (state->error == 0) {
          uVar4 = zlib_decompress((uchar **)&predict,(size_t *)&scanlines,
                                  (uchar *)scanlines.allocsize,(size_t)idat.data,
                                  &(state->decoder).zlibsettings);
          state->error = uVar4;
          if ((state->error == 0) && (scanlines.data != (uchar *)numpixels)) {
            state->error = 0x5b;
          }
        }
        ucvector_cleanup(&scanlines.allocsize);
        if (state->error == 0) {
          _critical_pos = lodepng_get_raw_size(*w,*h,&(state->info_png).color);
          puVar7 = (uchar *)lodepng_malloc(_critical_pos);
          *out = puVar7;
          if (*out == (uchar *)0x0) {
            state->error = 0x53;
          }
        }
        if (state->error == 0) {
          for (idat.allocsize = 0; idat.allocsize < _critical_pos;
              idat.allocsize = idat.allocsize + 1) {
            (*out)[idat.allocsize] = '\0';
          }
          uVar4 = postProcessScanlines(*out,(uchar *)predict,*w,*h,&state->info_png);
          state->error = uVar4;
        }
        ucvector_cleanup(&predict);
      }
      else {
        state->error = 0x5c;
      }
    }
    else {
      state->error = 0x5c;
    }
  }
  return;
}

Assistant:

static void decodeGeneric(unsigned char** out, unsigned* w, unsigned* h,
                          LodePNGState* state,
                          const unsigned char* in, size_t insize)
{
  unsigned char IEND = 0;
  const unsigned char* chunk;
  size_t i;
  ucvector idat; /*the data from idat chunks*/
  ucvector scanlines;
  size_t predict;
  size_t numpixels;
  size_t outsize = 0;

  /*for unknown chunk order*/
  unsigned unknown = 0;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
  unsigned critical_pos = 1; /*1 = after IHDR, 2 = after PLTE, 3 = after IDAT*/
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/

  /*provide some proper output values if error will happen*/
  *out = 0;

  state->error = lodepng_inspect(w, h, state, in, insize); /*reads header and resets other parameters in state->info_png*/
  if(state->error) return;

  numpixels = *w * *h;

  /*multiplication overflow*/
  if(*h != 0 && numpixels / *h != *w) CERROR_RETURN(state->error, 92);
  /*multiplication overflow possible further below. Allows up to 2^31-1 pixel
  bytes with 16-bit RGBA, the rest is room for filter bytes.*/
  if(numpixels > 268435455) CERROR_RETURN(state->error, 92);

  ucvector_init(&idat);
  chunk = &in[33]; /*first byte of the first chunk after the header*/

  /*loop through the chunks, ignoring unknown chunks and stopping at IEND chunk.
  IDAT data is put at the start of the in buffer*/
  while(!IEND && !state->error)
  {
    unsigned chunkLength;
    const unsigned char* data; /*the data in the chunk*/

    /*error: size of the in buffer too small to contain next chunk*/
    if((size_t)((chunk - in) + 12) > insize || chunk < in) CERROR_BREAK(state->error, 30);

    /*length of the data of the chunk, excluding the length bytes, chunk type and CRC bytes*/
    chunkLength = lodepng_chunk_length(chunk);
    /*error: chunk length larger than the max PNG chunk size*/
    if(chunkLength > 2147483647) CERROR_BREAK(state->error, 63);

    if((size_t)((chunk - in) + chunkLength + 12) > insize || (chunk + chunkLength + 12) < in)
    {
      CERROR_BREAK(state->error, 64); /*error: size of the in buffer too small to contain next chunk*/
    }

    data = lodepng_chunk_data_const(chunk);

    /*IDAT chunk, containing compressed image data*/
    if(lodepng_chunk_type_equals(chunk, "IDAT"))
    {
      size_t oldsize = idat.size;
      if(!ucvector_resize(&idat, oldsize + chunkLength)) CERROR_BREAK(state->error, 83 /*alloc fail*/);
      for(i = 0; i != chunkLength; ++i) idat.data[oldsize + i] = data[i];
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 3;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }
    /*IEND chunk*/
    else if(lodepng_chunk_type_equals(chunk, "IEND"))
    {
      IEND = 1;
    }
    /*palette chunk (PLTE)*/
    else if(lodepng_chunk_type_equals(chunk, "PLTE"))
    {
      state->error = readChunk_PLTE(&state->info_png.color, data, chunkLength);
      if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      critical_pos = 2;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }
    /*palette transparency chunk (tRNS)*/
    else if(lodepng_chunk_type_equals(chunk, "tRNS"))
    {
      state->error = readChunk_tRNS(&state->info_png.color, data, chunkLength);
      if(state->error) break;
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*background color chunk (bKGD)*/
    else if(lodepng_chunk_type_equals(chunk, "bKGD"))
    {
      state->error = readChunk_bKGD(&state->info_png, data, chunkLength);
      if(state->error) break;
    }
    /*text chunk (tEXt)*/
    else if(lodepng_chunk_type_equals(chunk, "tEXt"))
    {
      if(state->decoder.read_text_chunks)
      {
        state->error = readChunk_tEXt(&state->info_png, data, chunkLength);
        if(state->error) break;
      }
    }
    /*compressed text chunk (zTXt)*/
    else if(lodepng_chunk_type_equals(chunk, "zTXt"))
    {
      if(state->decoder.read_text_chunks)
      {
        state->error = readChunk_zTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
        if(state->error) break;
      }
    }
    /*international text chunk (iTXt)*/
    else if(lodepng_chunk_type_equals(chunk, "iTXt"))
    {
      if(state->decoder.read_text_chunks)
      {
        state->error = readChunk_iTXt(&state->info_png, &state->decoder.zlibsettings, data, chunkLength);
        if(state->error) break;
      }
    }
    else if(lodepng_chunk_type_equals(chunk, "tIME"))
    {
      state->error = readChunk_tIME(&state->info_png, data, chunkLength);
      if(state->error) break;
    }
    else if(lodepng_chunk_type_equals(chunk, "pHYs"))
    {
      state->error = readChunk_pHYs(&state->info_png, data, chunkLength);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    else /*it's not an implemented chunk type, so ignore it: skip over the data*/
    {
      /*error: unknown critical chunk (5th bit of first byte of chunk type is 0)*/
      if(!lodepng_chunk_ancillary(chunk)) CERROR_BREAK(state->error, 69);

      unknown = 1;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
      if(state->decoder.remember_unknown_chunks)
      {
        state->error = lodepng_chunk_append(&state->info_png.unknown_chunks_data[critical_pos - 1],
                                            &state->info_png.unknown_chunks_size[critical_pos - 1], chunk);
        if(state->error) break;
      }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    }

    if(!state->decoder.ignore_crc && !unknown) /*check CRC if wanted, only on known chunk types*/
    {
      if(lodepng_chunk_check_crc(chunk)) CERROR_BREAK(state->error, 57); /*invalid CRC*/
    }

    if(!IEND) chunk = lodepng_chunk_next_const(chunk);
  }